

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O3

size_t duckdb_zstd::ZSTD_buildBlockEntropyStats
                 (seqStore_t *seqStorePtr,ZSTD_entropyCTables_t *prevEntropy,
                 ZSTD_entropyCTables_t *nextEntropy,ZSTD_CCtx_params *cctxParams,
                 ZSTD_entropyCTablesMetadata_t *entropyMetadata,void *workspace,size_t wkspSize)

{
  void *workSpace;
  ZSTD_strategy ZVar1;
  BYTE *source;
  BYTE *pBVar2;
  symbolEncodingType_e sVar3;
  int iVar4;
  uint uVar5;
  size_t err_code_3;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  long lVar10;
  ulong sourceSize;
  size_t err_code;
  undefined8 uVar11;
  HUF_repeat local_9c;
  ZSTD_symbolEncodingTypeStats_t stats;
  
  source = seqStorePtr->litStart;
  pBVar2 = seqStorePtr->lit;
  ZVar1 = (cctxParams->cParams).strategy;
  if (cctxParams->literalCompressionMode == ZSTD_ps_enable) {
LAB_018b4fe2:
    stats.LLtype = 0xff;
    local_9c = (prevEntropy->huf).repeatMode;
    switchD_012bc561::default(nextEntropy,prevEntropy,0x810);
LAB_018b5024:
    sourceSize = (long)pBVar2 - (long)source;
    uVar9 = 0x3f;
    if ((prevEntropy->huf).repeatMode == HUF_repeat_valid) {
      uVar9 = 6;
    }
    sVar3 = set_basic;
    if (sourceSize <= uVar9) goto LAB_018b5217;
    sVar6 = HIST_count_wksp((uint *)workspace,&stats.LLtype,source,sourceSize,workspace,wkspSize);
    if (0xffffffffffffff88 < sVar6) {
LAB_018b52fd:
      (entropyMetadata->hufMetadata).hufDesSize = sVar6;
      return sVar6;
    }
    sVar3 = set_rle;
    if ((sVar6 == sourceSize) || (sVar3 = set_basic, sVar6 <= (sourceSize >> 7) + 4))
    goto LAB_018b5217;
    workSpace = (void *)((long)workspace + 0x400);
    sVar8 = wkspSize - 0x400;
    if (local_9c == HUF_repeat_check) {
      iVar4 = HUF_validateCTable((HUF_CElt *)prevEntropy,(uint *)workspace,stats.LLtype);
      local_9c = (HUF_repeat)(iVar4 != 0);
    }
    switchD_012e5a64::default(nextEntropy,0,0x808);
    uVar5 = HUF_optimalTableLog(0xb,sourceSize,stats.LLtype,workSpace,sVar8,(HUF_CElt *)nextEntropy,
                                (uint *)workspace,(uint)(7 < (int)ZVar1) * 2);
    sVar6 = HUF_buildCTable_wksp
                      ((HUF_CElt *)nextEntropy,(uint *)workspace,stats.LLtype,uVar5,workSpace,sVar8)
    ;
    if (0xffffffffffffff88 < sVar6) goto LAB_018b52fd;
    sVar7 = HUF_estimateCompressedSize((HUF_CElt *)nextEntropy,(uint *)workspace,stats.LLtype);
    sVar6 = HUF_writeCTable_wksp
                      ((entropyMetadata->hufMetadata).hufDesBuffer,0x80,(HUF_CElt *)nextEntropy,
                       stats.LLtype,(uint)sVar6,workSpace,sVar8);
    if (((local_9c != HUF_repeat_none) &&
        (sVar8 = HUF_estimateCompressedSize((HUF_CElt *)prevEntropy,(uint *)workspace,stats.LLtype),
        sVar8 < sourceSize)) && (sourceSize <= sVar6 + 0xc || sVar8 <= sVar6 + sVar7)) {
      switchD_012bc561::default(nextEntropy,prevEntropy,0x810);
      sVar3 = set_repeat;
      goto LAB_018b5217;
    }
    if (sourceSize <= sVar7 + sVar6) goto LAB_018b4f73;
    (entropyMetadata->hufMetadata).hType = set_compressed;
    (nextEntropy->huf).repeatMode = HUF_repeat_check;
    (entropyMetadata->hufMetadata).hufDesSize = sVar6;
    if (0xffffffffffffff88 < sVar6) {
      return sVar6;
    }
  }
  else {
    if (cctxParams->literalCompressionMode == ZSTD_ps_disable) {
      stats.LLtype = 0xff;
LAB_018b4f73:
      switchD_012bc561::default(nextEntropy,prevEntropy,0x810);
      sVar3 = set_basic;
    }
    else {
      if (ZVar1 != ZSTD_fast) goto LAB_018b4fe2;
      uVar5 = (cctxParams->cParams).targetLength;
      stats.LLtype = 0xff;
      local_9c = (prevEntropy->huf).repeatMode;
      switchD_012bc561::default(nextEntropy,prevEntropy,0x810);
      sVar3 = set_basic;
      if (uVar5 == 0) goto LAB_018b5024;
    }
LAB_018b5217:
    (entropyMetadata->hufMetadata).hType = sVar3;
    (entropyMetadata->hufMetadata).hufDesSize = 0;
  }
  lVar10 = (long)seqStorePtr->sequences - (long)seqStorePtr->sequencesStart;
  if (lVar10 == 0) {
    (nextEntropy->fse).litlength_repeatMode = FSE_repeat_none;
    (nextEntropy->fse).offcode_repeatMode = FSE_repeat_none;
    (nextEntropy->fse).matchlength_repeatMode = FSE_repeat_none;
    uVar11 = 0;
    stats.MLtype = set_basic;
    stats.size = 0;
    stats.lastCountSize = 0;
  }
  else {
    ZSTD_buildSequencesStatistics
              (&stats,seqStorePtr,lVar10 >> 3,&prevEntropy->fse,&nextEntropy->fse,
               (entropyMetadata->fseMetadata).fseTablesBuffer,
               &(entropyMetadata->fseMetadata).field_0x91,(cctxParams->cParams).strategy,
               (uint *)workspace,(void *)((long)workspace + 0xd4),wkspSize - 0xd4);
    if (0xffffffffffffff88 < stats.size) goto LAB_018b52d9;
    uVar11 = CONCAT44(stats.Offtype,stats.LLtype);
  }
  (entropyMetadata->fseMetadata).llType = (int)uVar11;
  (entropyMetadata->fseMetadata).ofType = (int)((ulong)uVar11 >> 0x20);
  (entropyMetadata->fseMetadata).mlType = stats.MLtype;
  (entropyMetadata->fseMetadata).lastCountSize = stats.lastCountSize;
LAB_018b52d9:
  (entropyMetadata->fseMetadata).fseTablesSize = stats.size;
  uVar9 = 0;
  if (0xffffffffffffff88 < stats.size) {
    uVar9 = stats.size;
  }
  return uVar9;
}

Assistant:

size_t ZSTD_buildBlockEntropyStats(
            const seqStore_t* seqStorePtr,
            const ZSTD_entropyCTables_t* prevEntropy,
                  ZSTD_entropyCTables_t* nextEntropy,
            const ZSTD_CCtx_params* cctxParams,
                  ZSTD_entropyCTablesMetadata_t* entropyMetadata,
                  void* workspace, size_t wkspSize)
{
    size_t const litSize = (size_t)(seqStorePtr->lit - seqStorePtr->litStart);
    int const huf_useOptDepth = (cctxParams->cParams.strategy >= HUF_OPTIMAL_DEPTH_THRESHOLD);
    int const hufFlags = huf_useOptDepth ? HUF_flags_optimalDepth : 0;

    entropyMetadata->hufMetadata.hufDesSize =
        ZSTD_buildBlockEntropyStats_literals(seqStorePtr->litStart, litSize,
                                            &prevEntropy->huf, &nextEntropy->huf,
                                            &entropyMetadata->hufMetadata,
                                            ZSTD_literalsCompressionIsDisabled(cctxParams),
                                            workspace, wkspSize, hufFlags);

    FORWARD_IF_ERROR(entropyMetadata->hufMetadata.hufDesSize, "ZSTD_buildBlockEntropyStats_literals failed");
    entropyMetadata->fseMetadata.fseTablesSize =
        ZSTD_buildBlockEntropyStats_sequences(seqStorePtr,
                                              &prevEntropy->fse, &nextEntropy->fse,
                                              cctxParams,
                                              &entropyMetadata->fseMetadata,
                                              workspace, wkspSize);
    FORWARD_IF_ERROR(entropyMetadata->fseMetadata.fseTablesSize, "ZSTD_buildBlockEntropyStats_sequences failed");
    return 0;
}